

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[44]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [21],uint *Args_4,char (*Args_5) [43],uint *Args_6,
          char (*Args_7) [18],char **Args_8,char (*Args_9) [44])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[44]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [29])this,(char **)Args,(char (*) [15])Args_1,(char (*) [21])Args_2,
             (uint *)Args_3,(char (*) [43])Args_4,(uint *)Args_5,(char (*) [18])Args_6,
             (char **)Args_7,(char (*) [44])Args_8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}